

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Lexer.cpp
# Opt level: O0

void __thiscall
psy::C::Lexer::DiagnosticsReporter::IncompatibleLanguageExtension
          (DiagnosticsReporter *this,string *feature,Ext expectedExt)

{
  SyntaxTree *this_00;
  IndexType tkIdx;
  Ext ext;
  DiagnosticDescriptor local_1a8;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_c9;
  string local_c8 [32];
  string local_a8 [32];
  undefined1 local_88 [8];
  DiagnosticDescriptor descriptor;
  Ext expectedExt_local;
  string *feature_local;
  DiagnosticsReporter *this_local;
  
  descriptor._103_1_ = expectedExt;
  std::__cxx11::string::string(local_a8,(string *)&ID_of_IncompatibleLanguageExtension_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"Incompatible language extension",&local_c9);
  std::operator+(&local_120,feature," is available in ");
  to_string_abi_cxx11_(&local_140,(C *)(ulong)(byte)descriptor._103_1_,ext);
  std::operator+(&local_100,&local_120,&local_140);
  psy::DiagnosticDescriptor::DiagnosticDescriptor
            ((DiagnosticDescriptor *)local_88,local_a8,local_c8,&local_100,1);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a8);
  this_00 = this->lexer_->tree_;
  DiagnosticDescriptor::DiagnosticDescriptor(&local_1a8,(DiagnosticDescriptor *)local_88);
  tkIdx = SyntaxTree::freeTokenSlot(this->lexer_->tree_);
  SyntaxTree::newDiagnostic(this_00,&local_1a8,tkIdx);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_1a8);
  DiagnosticDescriptor::~DiagnosticDescriptor((DiagnosticDescriptor *)local_88);
  return;
}

Assistant:

void Lexer::DiagnosticsReporter::IncompatibleLanguageExtension(
        const std::string& feature,
        LanguageExtensions::Ext expectedExt)
{
    DiagnosticDescriptor descriptor(ID_of_IncompatibleLanguageExtension,
                                    "Incompatible language extension",
                                    feature + " is available in " + to_string(expectedExt),
                                    DiagnosticSeverity::Warning,
                                    DiagnosticCategory::Syntax);

    lexer_->tree_->newDiagnostic(descriptor, lexer_->tree_->freeTokenSlot());
}